

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Vec_Wrd_t * Gia_ManSimPatSim(Gia_Man_t *pGia)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Wrd_t *vSims_00;
  bool bVar4;
  Vec_Wrd_t *vSims;
  int nWords;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGia_local;
  
  iVar1 = Vec_WrdSize(pGia->vSimsPi);
  iVar2 = Gia_ManCiNum(pGia);
  iVar1 = iVar1 / iVar2;
  iVar2 = Gia_ManObjNum(pGia);
  vSims_00 = Vec_WrdStart(iVar2 * iVar1);
  iVar2 = Vec_WrdSize(pGia->vSimsPi);
  iVar3 = Gia_ManCiNum(pGia);
  if (iVar2 % iVar3 != 0) {
    __assert_fail("Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x81,"Vec_Wrd_t *Gia_ManSimPatSim(Gia_Man_t *)");
  }
  Gia_ManSimPatAssignInputs(pGia,iVar1,vSims_00,pGia->vSimsPi);
  vSims._4_4_ = 0;
  while( true ) {
    bVar4 = false;
    if (vSims._4_4_ < pGia->nObjs) {
      _nWords = Gia_ManObj(pGia,vSims._4_4_);
      bVar4 = _nWords != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar2 = Gia_ObjIsAnd(_nWords);
    if (iVar2 != 0) {
      Gia_ManSimPatSimAnd(pGia,vSims._4_4_,_nWords,iVar1,vSims_00);
    }
    vSims._4_4_ = vSims._4_4_ + 1;
  }
  vSims._4_4_ = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pGia->vCos);
    bVar4 = false;
    if (vSims._4_4_ < iVar2) {
      _nWords = Gia_ManCo(pGia,vSims._4_4_);
      bVar4 = _nWords != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar2 = Gia_ObjId(pGia,_nWords);
    Gia_ManSimPatSimPo(pGia,iVar2,_nWords,iVar1,vSims_00);
    vSims._4_4_ = vSims._4_4_ + 1;
  }
  return vSims_00;
}

Assistant:

Vec_Wrd_t * Gia_ManSimPatSim( Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj;
    int i, nWords = Vec_WrdSize(pGia->vSimsPi) / Gia_ManCiNum(pGia);
    Vec_Wrd_t * vSims = Vec_WrdStart( Gia_ManObjNum(pGia) * nWords );
    assert( Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0 );
    Gia_ManSimPatAssignInputs( pGia, nWords, vSims, pGia->vSimsPi );
    Gia_ManForEachAnd( pGia, pObj, i ) 
        Gia_ManSimPatSimAnd( pGia, i, pObj, nWords, vSims );
    Gia_ManForEachCo( pGia, pObj, i )
        Gia_ManSimPatSimPo( pGia, Gia_ObjId(pGia, pObj), pObj, nWords, vSims );
    return vSims;
}